

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

RecyclerWeakReference<const_Js::FunctionBody> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
         *this,RecyclerWeakReference<const_Js::FunctionBody> *weakRef,RejitStats *value,int hash,
        uint bucket)

{
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar1;
  bool bVar2;
  int iVar3;
  
  if (this->freeCount < 1) {
    iVar3 = this->count;
    if (iVar3 == this->size) {
      bVar2 = Clean(this);
      if (bVar2) {
        iVar3 = this->freeList;
        this->freeList = (this->entries).ptr[iVar3].next;
        this->freeCount = this->freeCount + -1;
      }
      else {
        Resize(this);
        bucket = PrimePolicy::ModPrime(hash,this->size,this->modFunctionIndex);
        iVar3 = this->count;
        this->count = iVar3 + 1;
      }
    }
    else {
      this->count = iVar3 + 1;
    }
  }
  else {
    iVar3 = this->freeList;
    this->freeList = (this->entries).ptr[iVar3].next;
    this->freeCount = this->freeCount + -1;
  }
  pWVar1 = (this->entries).ptr;
  pWVar1[iVar3].next = (this->buckets).ptr[bucket];
  Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::FunctionBody>_>::
  WriteBarrierSet(&pWVar1[iVar3].key,weakRef);
  pWVar1 = (this->entries).ptr + iVar3;
  pWVar1->hash = hash;
  Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>::WriteBarrierSet(&pWVar1->value,value);
  (this->buckets).ptr[bucket] = iVar3;
  this->version = this->version + 1;
  return (this->entries).ptr[iVar3].key.ptr;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(const RecyclerWeakReference<TKey>* weakRef, TValue value, int hash, uint bucket)
        {
            int index;
            if (freeCount > 0)
            {
                index = freeList;
                freeList = entries[index].next;
                freeCount--;
            }
            else
            {
                if (count == size)
                {
                    if (cleanOnInsert && Clean())
                    {
                        index = freeList;
                        freeList = entries[index].next;
                        freeCount--;
                    }
                    else
                    {
                        Resize();
                        bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                        index = count;
                        count++;
                    }
                }
                else
                {
                    index = count;
                    count++;
                }
            }

            entries[index].next = buckets[bucket];
            entries[index].key = weakRef;
            entries[index].hash = hash;
            entries[index].value = value;
            buckets[bucket] = index;
            version++;

            return entries[index].key;
        }